

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Json.cpp
# Opt level: O2

int xmrig::Json::getInt(Value *obj,char *key,int defaultValue)

{
  ConstMemberIterator CVar1;
  
  CVar1 = rapidjson::
          GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
          ::FindMember(obj,key);
  if ((CVar1.ptr_ !=
       (Pointer)((ulong)(obj->data_).s.length * 0x20 + ((ulong)(obj->data_).s.str & 0xffffffffffff))
      ) && ((undefined1  [16])
            ((undefined1  [16])((CVar1.ptr_)->value).data_ & (undefined1  [16])0x20000000000000) !=
            (undefined1  [16])0x0)) {
    defaultValue = ((CVar1.ptr_)->value).data_.s.length;
  }
  return defaultValue;
}

Assistant:

int xmrig::Json::getInt(const rapidjson::Value &obj, const char *key, int defaultValue)
{
    assert(obj.IsObject());

    auto i = obj.FindMember(key);
    if (i != obj.MemberEnd() && i->value.IsInt()) {
        return i->value.GetInt();
    }

    return defaultValue;
}